

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

void run_container_append_value(run_container_t *run,uint16_t val,rle16_t *previousrl)

{
  int iVar1;
  rle16_t local_20;
  uint32_t previousend;
  rle16_t *previousrl_local;
  uint16_t val_local;
  run_container_t *run_local;
  
  iVar1 = (uint)previousrl->value + (uint)previousrl->length;
  if (iVar1 + 1U < (uint)val) {
    local_20.length = 0;
    local_20.value = val;
    *previousrl = local_20;
    run->runs[run->n_runs] = *previousrl;
    run->n_runs = run->n_runs + 1;
  }
  else if ((uint)val == iVar1 + 1U) {
    previousrl->length = previousrl->length + 1;
    run->runs[run->n_runs + -1] = *previousrl;
  }
  return;
}

Assistant:

static inline void run_container_append_value(run_container_t *run,
                                              uint16_t val,
                                              rle16_t *previousrl) {
    const uint32_t previousend = previousrl->value + previousrl->length;
    if (val > previousend + 1) {  // we add a new one
        *previousrl = CROARING_MAKE_RLE16(val, 0);
        run->runs[run->n_runs] = *previousrl;
        run->n_runs++;
    } else if (val == previousend + 1) {  // we merge
        previousrl->length++;
        run->runs[run->n_runs - 1] = *previousrl;
    }
}